

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffs.h
# Opt level: O1

void __thiscall libDAI::Diffs::Diffs(Diffs *this,long maxsize,double def)

{
  pointer pdVar1;
  
  (this->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->_maxsize = maxsize;
  this->_def = def;
  (this->_pos)._M_current = (double *)0x0;
  (this->_maxpos)._M_current = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            (&this->super_vector<double,_std::allocator<double>_>,maxsize);
  pdVar1 = (this->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  (this->_pos)._M_current = pdVar1;
  (this->_maxpos)._M_current = pdVar1;
  return;
}

Assistant:

Diffs(long maxsize, double def) : std::vector<double>(), _maxsize(maxsize), _def(def) { 
                this->reserve(_maxsize); 
                _pos = begin(); 
                _maxpos = begin(); 
            }